

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __last;
  __normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
  __first;
  ulong uVar2;
  bool bVar3;
  size_type sVar4;
  float *pfVar5;
  Yolov3DetectionOutput *pYVar6;
  reference pvVar7;
  reference this_00;
  reference pvVar8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar9;
  float *outptr;
  float score_1;
  BBoxRect *r;
  int i_3;
  Mat *top_blob;
  int num_detected;
  size_t z;
  size_t i_2;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *box_bbox_rects;
  int i_1;
  BBoxRect c;
  float area;
  float bbox_ymax;
  float bbox_xmax;
  float bbox_ymin;
  float bbox_xmin;
  float bbox_h;
  float bbox_w;
  float bbox_cy;
  float bbox_cx;
  float confidence;
  float score;
  int q;
  float class_score;
  int class_index;
  int j;
  int i;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  float bias_h;
  float bias_w;
  int biases_index;
  int p;
  int pp;
  int net_h;
  int net_w;
  size_t mask_offset;
  int channels_per_box;
  int channels;
  int h;
  int w;
  Mat *bottom_top_blobs;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  size_t b;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  *in_stack_fffffffffffffb58;
  Mat *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  Yolov3DetectionOutput *in_stack_fffffffffffffb70;
  size_type in_stack_fffffffffffffb78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar10;
  Mat *in_stack_fffffffffffffb80;
  iterator in_stack_fffffffffffffb88;
  float in_stack_fffffffffffffb9c;
  float in_stack_fffffffffffffba0;
  float in_stack_fffffffffffffba4;
  float in_stack_fffffffffffffba8;
  float in_stack_fffffffffffffbac;
  float in_stack_fffffffffffffbb0;
  float in_stack_fffffffffffffbb4;
  const_iterator in_stack_fffffffffffffbb8;
  int local_3bc;
  Yolov3DetectionOutput *local_3a0;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  local_398;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_380;
  BBoxRect *local_368;
  BBoxRect *local_360;
  BBoxRect *local_358;
  BBoxRect *local_350;
  reference local_340;
  int local_338;
  float local_334;
  float local_330;
  float local_32c;
  float local_328;
  float local_324;
  float local_320;
  int local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  Mat local_2f0;
  float local_2a8;
  int local_2a4;
  float local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  Mat local_248;
  float *local_200;
  Mat local_1f8;
  float *local_1b0;
  Mat local_1a8;
  float *local_160;
  Mat local_158;
  float *local_110;
  Mat local_108;
  float *local_c0;
  float local_b4;
  float local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long local_98;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  const_reference local_78;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  local_60;
  ulong local_48;
  undefined1 local_40 [60];
  int local_4;
  
  local_40._32_8_ = in_RDX;
  local_40._40_8_ = in_RSI;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x724a74);
  local_48 = 0;
  while( true ) {
    uVar2 = local_48;
    sVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size
                      ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_40._40_8_);
    if (sVar4 <= uVar2) break;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)0x724ac6);
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    local_78 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                         ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_40._40_8_,local_48)
    ;
    local_7c = local_78->w;
    local_80 = local_78->h;
    local_84 = local_78->c;
    local_88 = local_84 / *(int *)(in_RDI + 0xd4);
    if (local_88 == *(int *)(in_RDI + 0xd0) + 5) {
      local_98 = local_48 * (long)*(int *)(in_RDI + 0xd4);
      pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x170),local_48);
      local_9c = (int)(*pfVar5 * (float)local_7c);
      pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x170),local_48);
      local_a0 = (int)(*pfVar5 * (float)local_80);
      for (local_a4 = 0; local_a4 < *(int *)(in_RDI + 0xd4); local_a4 = local_a4 + 1) {
        local_a8 = local_a4 * local_88;
        pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0x128),local_a4 + local_98);
        local_ac = (int)*pfVar5;
        pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)(local_ac * 2));
        local_b0 = *pfVar5;
        pfVar5 = ncnn::Mat::operator[]((Mat *)(in_RDI + 0xe0),(long)(local_ac * 2 + 1));
        local_b4 = *pfVar5;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb88._M_current,
                           (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_108);
        ncnn::Mat::~Mat((Mat *)0x724d91);
        local_c0 = pfVar5;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb88._M_current,
                           (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_158);
        ncnn::Mat::~Mat((Mat *)0x724de5);
        local_110 = pfVar5;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb88._M_current,
                           (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_1a8);
        ncnn::Mat::~Mat((Mat *)0x724e37);
        local_160 = pfVar5;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb88._M_current,
                           (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_1f8);
        ncnn::Mat::~Mat((Mat *)0x724e86);
        local_1b0 = pfVar5;
        ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb88._M_current,
                           (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
        pfVar5 = ncnn::Mat::operator_cast_to_float_(&local_248);
        ncnn::Mat::~Mat((Mat *)0x724ed5);
        local_200 = pfVar5;
        ncnn::Mat::channel_range
                  ((Mat *)in_stack_fffffffffffffb88._M_current,
                   (int)((ulong)in_stack_fffffffffffffb80 >> 0x20),(int)in_stack_fffffffffffffb80);
        for (local_294 = 0; local_294 < local_80; local_294 = local_294 + 1) {
          for (local_298 = 0; local_298 < local_7c; local_298 = local_298 + 1) {
            local_29c = 0;
            local_2a0 = -3.4028235e+38;
            for (local_2a4 = 0; local_2a4 < *(int *)(in_RDI + 0xd0); local_2a4 = local_2a4 + 1) {
              ncnn::Mat::channel((Mat *)in_stack_fffffffffffffb88._M_current,
                                 (int)((ulong)in_stack_fffffffffffffb80 >> 0x20));
              in_stack_fffffffffffffbb8._M_current =
                   (BBoxRect *)ncnn::Mat::row(&local_2f0,local_294);
              in_stack_fffffffffffffbb4 =
                   (&(in_stack_fffffffffffffbb8._M_current)->score)[local_298];
              ncnn::Mat::~Mat((Mat *)0x724fef);
              if (local_2a0 < in_stack_fffffffffffffbb4) {
                local_29c = local_2a4;
                local_2a0 = in_stack_fffffffffffffbb4;
              }
              local_2a8 = in_stack_fffffffffffffbb4;
            }
            dVar9 = std::exp((double)((ulong)(uint)*local_200 ^ 0x8000000080000000));
            in_stack_fffffffffffffbb0 = SUB84(dVar9,0);
            dVar9 = std::exp((double)((ulong)(uint)local_2a0 ^ 0x8000000080000000));
            in_stack_fffffffffffffbac = SUB84(dVar9,0);
            local_2f4 = 1.0 / (in_stack_fffffffffffffbb0 * (in_stack_fffffffffffffbac + 1.0) + 1.0);
            if (*(float *)(in_RDI + 0xd8) <= local_2f4) {
              in_stack_fffffffffffffba4 = (float)local_298;
              in_stack_fffffffffffffba8 = sigmoid(0.0);
              local_2f8 = (in_stack_fffffffffffffba4 + in_stack_fffffffffffffba8) / (float)local_7c;
              in_stack_fffffffffffffb9c = (float)local_294;
              in_stack_fffffffffffffba0 = sigmoid(0.0);
              local_2fc = (in_stack_fffffffffffffb9c + in_stack_fffffffffffffba0) / (float)local_80;
              dVar9 = std::exp((double)(ulong)(uint)*local_160);
              local_300 = (SUB84(dVar9,0) * local_b0) / (float)local_9c;
              dVar9 = std::exp((double)(ulong)(uint)*local_1b0);
              local_304 = (SUB84(dVar9,0) * local_b4) / (float)local_a0;
              local_330 = local_2f8 - local_300 * 0.5;
              local_32c = local_2fc - local_304 * 0.5;
              local_328 = local_2f8 + local_300 * 0.5;
              local_324 = local_2fc + local_304 * 0.5;
              local_320 = local_300 * local_304;
              local_334 = local_2f4;
              local_31c = local_29c;
              local_318 = local_320;
              local_314 = local_324;
              local_310 = local_328;
              local_30c = local_32c;
              local_308 = local_330;
              std::
              vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
              ::operator[](&local_60,(long)local_a4);
              std::
              vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)in_stack_fffffffffffffb70,
                          (value_type *)
                          CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
            }
            local_c0 = local_c0 + 1;
            local_110 = local_110 + 1;
            local_160 = local_160 + 1;
            local_1b0 = local_1b0 + 1;
            local_200 = local_200 + 1;
          }
        }
        ncnn::Mat::~Mat((Mat *)0x725504);
      }
      for (local_338 = 0; local_338 < *(int *)(in_RDI + 0xd4); local_338 = local_338 + 1) {
        local_340 = std::
                    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                    ::operator[](&local_60,(long)local_338);
        in_stack_fffffffffffffb80 = (Mat *)local_40;
        local_350 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffffb58);
        __gnu_cxx::
        __normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>
        ::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect*>
                  ((__normal_iterator<const_ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffffb60,
                   (__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_*,_std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>
                    *)in_stack_fffffffffffffb58);
        local_358 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::begin(in_stack_fffffffffffffb58);
        local_360 = (BBoxRect *)
                    std::
                    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ::end(in_stack_fffffffffffffb58);
        __first._M_current._4_4_ = in_stack_fffffffffffffbb4;
        __first._M_current._0_4_ = in_stack_fffffffffffffbb0;
        __last._M_current._4_4_ = in_stack_fffffffffffffbac;
        __last._M_current._0_4_ = in_stack_fffffffffffffba8;
        in_stack_fffffffffffffb88 =
             std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
             ::
             insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                       ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                        in_stack_fffffffffffffbb8,__first,__last);
        local_368 = in_stack_fffffffffffffb88._M_current;
      }
      local_8c = 0;
    }
    else {
      local_4 = -1;
      local_8c = 1;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
               *)in_stack_fffffffffffffb70);
    if (local_8c != 0) goto LAB_007259d7;
    local_48 = local_48 + 1;
  }
  qsort_descent_inplace
            (in_stack_fffffffffffffb70,
             (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
              *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
  pvVar10 = &local_380;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x725693);
  nms_sorted_bboxes((Yolov3DetectionOutput *)
                    CONCAT44(in_stack_fffffffffffffbb4,in_stack_fffffffffffffbb0),
                    (vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                    in_stack_fffffffffffffb9c);
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            *)0x7256c4);
  local_3a0 = (Yolov3DetectionOutput *)0x0;
  while( true ) {
    in_stack_fffffffffffffb70 = local_3a0;
    pYVar6 = (Yolov3DetectionOutput *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_380);
    if (pYVar6 <= in_stack_fffffffffffffb70) break;
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&local_380,(size_type)local_3a0);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::operator[]((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  *)local_40,*pvVar7);
    std::
    vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
    ::push_back((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 *)in_stack_fffffffffffffb70,
                (value_type *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
    local_3a0 = (Yolov3DetectionOutput *)((long)&(local_3a0->super_Layer)._vptr_Layer + 1);
  }
  sVar4 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size(&local_398);
  if ((int)sVar4 == 0) {
    local_4 = 0;
  }
  else {
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                        ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)local_40._32_8_,0);
    ncnn::Mat::create(in_stack_fffffffffffffb80,(int)((ulong)pvVar10 >> 0x20),(int)pvVar10,
                      (size_t)in_stack_fffffffffffffb70,
                      (Allocator *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
    bVar3 = ncnn::Mat::empty(in_stack_fffffffffffffb60);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      for (local_3bc = 0; local_3bc < (int)sVar4; local_3bc = local_3bc + 1) {
        pvVar8 = std::
                 vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ::operator[](&local_398,(long)local_3bc);
        fVar1 = pvVar8->score;
        pfVar5 = ncnn::Mat::row(this_00,local_3bc);
        *pfVar5 = (float)(pvVar8->label + 1);
        pfVar5[1] = fVar1;
        pfVar5[2] = pvVar8->xmin;
        pfVar5[3] = pvVar8->ymin;
        pfVar5[4] = pvVar8->xmax;
        pfVar5[5] = pvVar8->ymax;
      }
      local_4 = 0;
    }
  }
  local_8c = 1;
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffffb70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffb70);
LAB_007259d7:
  std::
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ::~vector((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             *)in_stack_fffffffffffffb70);
  return local_4;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}